

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigTests.cpp
# Opt level: O0

set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> * __thiscall
deqp::egl::(anonymous_namespace)::toSet<unsigned_int,6ul>
          (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,uint (*arr) [6])

{
  ulong local_28;
  size_t i;
  uint (*arr_local) [6];
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *set;
  
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (__return_storage_ptr__);
  for (local_28 = 0; local_28 < 6; local_28 = local_28 + 1) {
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
              (__return_storage_ptr__,(value_type_conflict6 *)(this + local_28 * 4));
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<T> toSet (const T (&arr)[N])
{
	std::set<T> set;
	for (size_t i = 0; i < N; i++)
		set.insert(arr[i]);
	return set;
}